

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O0

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  ssize_t dlen;
  char data [2] [12];
  socklen_t local_38;
  int reuse;
  curl_socklen_t addrlen;
  curl_socket_t listener;
  anon_union_16_2_022c54a6 a;
  curl_socket_t *socks_local;
  int protocol_local;
  int type_local;
  int domain_local;
  
  local_38 = 0x10;
  data[1][8] = '\x01';
  data[1][9] = '\0';
  data[1][10] = '\0';
  data[1][0xb] = '\0';
  a.inaddr.sin_zero = (uchar  [8])socks;
  socks_local._0_4_ = protocol;
  socks_local._4_4_ = type;
  protocol_local = domain;
  reuse = socket(2,1,6);
  if (reuse != -1) {
    memset(&addrlen,0,0x10);
    addrlen._0_2_ = 2;
    listener = htonl(0x7f000001);
    addrlen._2_2_ = 0;
    *(undefined4 *)((long)a.inaddr.sin_zero + 4) = 0xffffffff;
    *(undefined4 *)a.inaddr.sin_zero = 0xffffffff;
    iVar1 = setsockopt(reuse,1,2,data[1] + 8,4);
    if ((((iVar1 != -1) && (iVar1 = bind(reuse,(sockaddr *)&addrlen,0x10), iVar1 != -1)) &&
        (iVar1 = getsockname(reuse,(sockaddr *)&addrlen,&local_38), iVar1 != -1)) &&
       (iVar1 = listen(reuse,1), iVar1 != -1)) {
      iVar1 = socket(2,1,0);
      *(int *)a.inaddr.sin_zero = iVar1;
      if ((*(int *)a.inaddr.sin_zero != -1) &&
         (iVar1 = connect(*(int *)a.inaddr.sin_zero,(sockaddr *)&addrlen,0x10), iVar1 != -1)) {
        iVar1 = accept(reuse,(sockaddr *)0x0,(socklen_t *)0x0);
        *(int *)((long)a.inaddr.sin_zero + 4) = iVar1;
        if (*(int *)((long)a.inaddr.sin_zero + 4) != -1) {
          curl_msnprintf((char *)&dlen,0xc,"%p",a.inaddr.sin_zero);
          __n = strlen((char *)&dlen);
          sVar2 = send(*(int *)a.inaddr.sin_zero,&dlen,__n,0x4000);
          if (((sVar2 == __n) &&
              (sVar2 = recv(*(int *)((long)a.inaddr.sin_zero + 4),data[0] + 4,0xc,0), sVar2 == __n))
             && (iVar1 = memcmp(&dlen,data[0] + 4,__n), iVar1 == 0)) {
            close(reuse);
            return 0;
          }
        }
      }
    }
    close(reuse);
    close(*(int *)a.inaddr.sin_zero);
    close(*(int *)((long)a.inaddr.sin_zero + 4));
  }
  return -1;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2])
{
  union {
    struct sockaddr_in inaddr;
    struct sockaddr addr;
  } a;
  curl_socket_t listener;
  curl_socklen_t addrlen = sizeof(a.inaddr);
  int reuse = 1;
  char data[2][12];
  ssize_t dlen;
  (void)domain;
  (void)type;
  (void)protocol;

  listener = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  if(listener == CURL_SOCKET_BAD)
    return -1;

  memset(&a, 0, sizeof(a));
  a.inaddr.sin_family = AF_INET;
  a.inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  a.inaddr.sin_port = 0;

  socks[0] = socks[1] = CURL_SOCKET_BAD;

  if(setsockopt(listener, SOL_SOCKET, SO_REUSEADDR,
                (char *)&reuse, (curl_socklen_t)sizeof(reuse)) == -1)
    goto error;
  if(bind(listener, &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  if(getsockname(listener, &a.addr, &addrlen) == -1)
    goto error;
  if(listen(listener, 1) == -1)
    goto error;
  socks[0] = socket(AF_INET, SOCK_STREAM, 0);
  if(socks[0] == CURL_SOCKET_BAD)
    goto error;
  if(connect(socks[0], &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  socks[1] = accept(listener, NULL, NULL);
  if(socks[1] == CURL_SOCKET_BAD)
    goto error;

  /* verify that nothing else connected */
  msnprintf(data[0], sizeof(data[0]), "%p", socks);
  dlen = strlen(data[0]);
  if(swrite(socks[0], data[0], dlen) != dlen)
    goto error;
  if(sread(socks[1], data[1], sizeof(data[1])) != dlen)
    goto error;
  if(memcmp(data[0], data[1], dlen))
    goto error;

  sclose(listener);
  return 0;

  error:
  sclose(listener);
  sclose(socks[0]);
  sclose(socks[1]);
  return -1;
}